

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * mg_md5(char *buf,...)

{
  md5_byte_t *data;
  char in_AL;
  size_t nbytes;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_170;
  undefined8 local_158 [4];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined1 local_a0 [8];
  md5_state_t ctx;
  va_list ap;
  char *p;
  md5_byte_t hash [16];
  char *buf_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  local_158[1] = in_RSI;
  local_158[2] = in_RDX;
  local_158[3] = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  md5_init((md5_state_t *)local_a0);
  ap[0]._0_8_ = &stack0x00000008;
  ctx.buf[0x3c] = '0';
  ctx.buf[0x3d] = '\0';
  ctx.buf[0x3e] = '\0';
  ctx.buf[0x3f] = '\0';
  ctx.buf[0x38] = '\b';
  ctx.buf[0x39] = '\0';
  ctx.buf[0x3a] = '\0';
  ctx.buf[0x3b] = '\0';
  while( true ) {
    if ((uint)ctx.buf._56_4_ < 0x29) {
      local_170 = (undefined8 *)((long)local_158 + (long)(int)ctx.buf._56_4_);
      ctx.buf._56_4_ = ctx.buf._56_4_ + 8;
    }
    else {
      local_170 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    data = (md5_byte_t *)*local_170;
    if (data == (md5_byte_t *)0x0) break;
    nbytes = strlen((char *)data);
    md5_append((md5_state_t *)local_a0,data,nbytes);
  }
  md5_finish((md5_state_t *)local_a0,(md5_byte_t *)&p);
  bin2str(buf,(uchar *)&p,0x10);
  return buf;
}

Assistant:

CIVETWEB_API char *
mg_md5(char buf[33], ...)
{
	md5_byte_t hash[16];
	const char *p;
	va_list ap;
	md5_state_t ctx;

	md5_init(&ctx);

	va_start(ap, buf);
	while ((p = va_arg(ap, const char *)) != NULL) {
		md5_append(&ctx, (const md5_byte_t *)p, strlen(p));
	}
	va_end(ap);

	md5_finish(&ctx, hash);
	bin2str(buf, hash, sizeof(hash));
	return buf;
}